

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

void ggml_quantize_free(void)

{
  ggml_critical_section_start();
  iq2xs_free_impl(GGML_TYPE_IQ2_XXS);
  iq2xs_free_impl(GGML_TYPE_IQ2_XS);
  iq2xs_free_impl(GGML_TYPE_IQ1_S);
  iq3xs_free_impl(0x100);
  ggml_critical_section_end();
  return;
}

Assistant:

void ggml_quantize_free(void) {
    ggml_critical_section_start();

    iq2xs_free_impl(GGML_TYPE_IQ2_XXS);
    iq2xs_free_impl(GGML_TYPE_IQ2_XS);
    iq2xs_free_impl(GGML_TYPE_IQ1_S);
    iq3xs_free_impl(256);

    ggml_critical_section_end();
}